

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall cmComputeTargetDepends::DisplaySideEffects(cmComputeTargetDepends *this)

{
  mapped_type mVar1;
  FILE *pFVar2;
  bool bVar3;
  cmGeneratorTarget *pcVar4;
  reference ppcVar5;
  undefined8 uVar6;
  reference pvVar7;
  reference ppVar8;
  reference ppcVar9;
  mapped_type *pmVar10;
  cmGeneratorTarget *local_88;
  cmGeneratorTarget *gt_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range3_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>
  *it;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *__range2;
  cmGeneratorTarget *gt;
  iterator __end3;
  iterator __begin3;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range3;
  cmGeneratorTarget *depender;
  size_t depender_index;
  size_t n;
  cmComputeTargetDepends *this_local;
  
  fprintf(_stderr,"The side effects are:\n");
  pcVar4 = (cmGeneratorTarget *)
           std::
           vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
           ::size(&this->SideEffects);
  for (depender = (cmGeneratorTarget *)0x0; depender < pcVar4;
      depender = (cmGeneratorTarget *)((long)&depender->Target + 1)) {
    ppcVar5 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              operator[](&this->Targets,(size_type)depender);
    pFVar2 = _stderr;
    cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar5);
    uVar6 = std::__cxx11::string::c_str();
    fprintf(pFVar2,"target %zu is [%s]\n",depender,uVar6);
    pvVar7 = std::
             vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
             ::operator[](&this->SideEffects,(size_type)depender);
    bVar3 = std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::empty(&pvVar7->CustomCommandSideEffects);
    if (!bVar3) {
      fprintf(_stderr,"  custom commands\n");
      pvVar7 = std::
               vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ::operator[](&this->SideEffects,(size_type)depender);
      __end3 = std::
               set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
               ::begin(&pvVar7->CustomCommandSideEffects);
      gt = (cmGeneratorTarget *)
           std::
           set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
           ::end(&pvVar7->CustomCommandSideEffects);
      while (bVar3 = std::operator!=(&__end3,(_Self *)&gt), bVar3) {
        ppcVar9 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end3);
        pFVar2 = _stderr;
        __range2 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                    *)*ppcVar9;
        pmVar10 = std::
                  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                  ::operator[](&this->TargetIndex,(key_type *)&__range2);
        mVar1 = *pmVar10;
        cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)__range2);
        uVar6 = std::__cxx11::string::c_str();
        fprintf(pFVar2,"    from target %zu [%s]\n",mVar1,uVar6);
        std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end3);
      }
    }
    pvVar7 = std::
             vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
             ::operator[](&this->SideEffects,(size_type)depender);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
             ::begin(&pvVar7->LanguageSideEffects);
    it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
            ::end(&pvVar7->LanguageSideEffects);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&it), bVar3) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>
               ::operator*(&__end2);
      pFVar2 = _stderr;
      uVar6 = std::__cxx11::string::c_str();
      fprintf(pFVar2,"  language %s\n",uVar6);
      __end3_1 = std::
                 set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::begin(&ppVar8->second);
      gt_1 = (cmGeneratorTarget *)
             std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::end(&ppVar8->second);
      while (bVar3 = std::operator!=(&__end3_1,(_Self *)&gt_1), bVar3) {
        ppcVar9 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end3_1);
        pFVar2 = _stderr;
        local_88 = *ppcVar9;
        pmVar10 = std::
                  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                  ::operator[](&this->TargetIndex,&local_88);
        mVar1 = *pmVar10;
        cmGeneratorTarget::GetName_abi_cxx11_(local_88);
        uVar6 = std::__cxx11::string::c_str();
        fprintf(pFVar2,"    from target %zu [%s]\n",mVar1,uVar6);
        std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end3_1);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>
      ::operator++(&__end2);
    }
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void cmComputeTargetDepends::DisplaySideEffects()
{
  fprintf(stderr, "The side effects are:\n");
  size_t n = this->SideEffects.size();
  for (size_t depender_index = 0; depender_index < n; ++depender_index) {
    cmGeneratorTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %zu is [%s]\n", depender_index,
            depender->GetName().c_str());
    if (!this->SideEffects[depender_index].CustomCommandSideEffects.empty()) {
      fprintf(stderr, "  custom commands\n");
      for (auto const* gt :
           this->SideEffects[depender_index].CustomCommandSideEffects) {
        fprintf(stderr, "    from target %zu [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
    for (auto const& it :
         this->SideEffects[depender_index].LanguageSideEffects) {
      fprintf(stderr, "  language %s\n", it.first.c_str());
      for (auto const* gt : it.second) {
        fprintf(stderr, "    from target %zu [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
  }
  fprintf(stderr, "\n");
}